

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O2

MPP_RET mpp_dec_reset(MppDec ctx)

{
  code *pcVar1;
  uint uVar2;
  MPP_RET MVar3;
  ulong uVar4;
  
  if (ctx == (MppDec)0x0) {
    _mpp_log_l(2,"mpp_dec","found NULL input dec %p\n","mpp_dec_reset",0);
    MVar3 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","%p in\n","mpp_dec_reset",ctx);
    }
    uVar4 = 0;
    if ((*(long *)((long)ctx + 8) != 0) &&
       (pcVar1 = *(code **)(*(long *)((long)ctx + 8) + 0x10), pcVar1 != (code *)0x0)) {
      uVar2 = (*pcVar1)(ctx);
      uVar4 = (ulong)uVar2;
    }
    MVar3 = (MPP_RET)uVar4;
    if (((byte)mpp_dec_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec","%p out ret %d\n","mpp_dec_reset",ctx,uVar4);
    }
  }
  return MVar3;
}

Assistant:

MPP_RET mpp_dec_reset(MppDec ctx)
{
    MppDecImpl *dec = (MppDecImpl *)ctx;
    MPP_RET ret = MPP_OK;

    if (NULL == dec) {
        mpp_err_f("found NULL input dec %p\n", dec);
        return MPP_ERR_NULL_PTR;
    }

    dec_dbg_func("%p in\n", dec);

    if (dec->api && dec->api->reset)
        ret = dec->api->reset(dec);

    dec_dbg_func("%p out ret %d\n", dec, ret);

    return ret;
}